

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<32U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::mul_by_limb
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,limb_type v)

{
  iterator puVar1;
  iterator last;
  const_iterator a;
  limb_type v_local;
  uintwide_t<32U,_unsigned_int,_void,_true> *this_local;
  
  if (v == 0) {
    puVar1 = detail::array_detail::array<unsigned_int,_1UL>::begin((array<unsigned_int,_1UL> *)this)
    ;
    last = detail::array_detail::array<unsigned_int,_1UL>::end((array<unsigned_int,_1UL> *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(puVar1,last,0);
  }
  else if (1 < v) {
    puVar1 = detail::array_detail::array<unsigned_int,_1UL>::begin((array<unsigned_int,_1UL> *)this)
    ;
    a = detail::array_detail::array<unsigned_int,_1UL>::cbegin((array<unsigned_int,_1UL> *)this);
    uintwide_t<32u,unsigned_int,void,true>::eval_multiply_1d<unsigned_int*,unsigned_int_const*>
              (puVar1,a,v,1);
  }
  return this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }